

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O1

void __thiscall
llvm::write_hex(llvm *this,raw_ostream *S,uint64_t N,HexPrintStyle Style,
               Optional<unsigned_long> Width)

{
  bool bVar1;
  long lVar2;
  char cVar3;
  ulong uVar4;
  uint uVar5;
  undefined4 in_register_0000000c;
  void *__buf;
  void *__n;
  char *pcVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  undefined8 uStack_90;
  undefined8 uStack_88;
  char NumberBuffer [128];
  
  uVar4 = 0x80;
  if (CONCAT44(in_register_0000000c,Style) < 0x80) {
    uVar4 = CONCAT44(in_register_0000000c,Style);
  }
  if (S == (raw_ostream *)0x0) {
    uVar5 = 0x40;
  }
  else {
    lVar2 = 0x3f;
    if (S != (raw_ostream *)0x0) {
      for (; (ulong)S >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar5 = (uint)lVar2 ^ 0x3f;
  }
  uVar8 = 0x43 - uVar5 >> 2;
  uVar5 = (uint)N & 0xfffffffe;
  uVar9 = 0;
  if (((undefined1  [16])Width.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    uVar9 = (uint)uVar4;
  }
  uVar8 = (uint)(uVar5 == 2) * 2 + uVar8 + (uint)(uVar8 == 0);
  if (uVar8 < uVar9) {
    uVar8 = uVar9;
  }
  __buf = (void *)(ulong)uVar8;
  builtin_strncpy(NumberBuffer + 0x68,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x58,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x48,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x38,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x28,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x18,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 8,"0000000000000000",0x10);
  uStack_88 = 0x3030303030303030;
  builtin_strncpy(NumberBuffer,"00000000",8);
  if (uVar5 == 2) {
    uStack_88 = 0x3030303030307830;
  }
  __n = __buf;
  if (S != (raw_ostream *)0x0) {
    uVar5 = (uint)((N & 0xfffffffd) != 0) * 0x20 + 0x37;
    __n = (void *)(ulong)uVar5;
    pcVar6 = (char *)((long)&uStack_90 + 7 + (long)__buf);
    do {
      uVar8 = (uint)S & 0xf;
      cVar3 = (char)uVar8;
      cVar7 = cVar3 + '0';
      if (9 < uVar8) {
        cVar7 = (char)uVar5 + cVar3;
      }
      *pcVar6 = cVar7;
      pcVar6 = pcVar6 + -1;
      bVar1 = (raw_ostream *)0xf < S;
      S = (raw_ostream *)((ulong)S >> 4);
    } while (bVar1);
  }
  uStack_90 = 0xdb143f;
  raw_ostream::write((raw_ostream *)this,(int)&uStack_88,__buf,(size_t)__n);
  return;
}

Assistant:

void llvm::write_hex(raw_ostream &S, uint64_t N, HexPrintStyle Style,
                     Optional<size_t> Width) {
  const size_t kMaxWidth = 128u;

  size_t W = std::min(kMaxWidth, Width.getValueOr(0u));

  unsigned Nibbles = (64 - countLeadingZeros(N) + 3) / 4;
  bool Prefix = (Style == HexPrintStyle::PrefixLower ||
                 Style == HexPrintStyle::PrefixUpper);
  bool Upper =
      (Style == HexPrintStyle::Upper || Style == HexPrintStyle::PrefixUpper);
  unsigned PrefixChars = Prefix ? 2 : 0;
  unsigned NumChars =
      std::max(static_cast<unsigned>(W), std::max(1u, Nibbles) + PrefixChars);

  char NumberBuffer[kMaxWidth];
  ::memset(NumberBuffer, '0', llvm::array_lengthof(NumberBuffer));
  if (Prefix)
    NumberBuffer[1] = 'x';
  char *EndPtr = NumberBuffer + NumChars;
  char *CurPtr = EndPtr;
  while (N) {
    unsigned char x = static_cast<unsigned char>(N) % 16;
    *--CurPtr = hexdigit(x, !Upper);
    N /= 16;
  }

  S.write(NumberBuffer, NumChars);
}